

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

void __thiscall CmdLineArgsParser::ParseNumberSet(CmdLineArgsParser *this,NumberSet *numberPairSet)

{
  char16 cVar1;
  uint32 x_00;
  int x;
  NumberSet *numberPairSet_local;
  CmdLineArgsParser *this_local;
  
  while( true ) {
    x_00 = ParseInteger(this);
    Js::NumberSet::Add(numberPairSet,x_00);
    cVar1 = CurChar(this);
    if (cVar1 != L';') break;
    NextChar(this);
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseNumberSet(Js::NumberSet * numberPairSet)
{
    while (true)
    {
        int x = ParseInteger();
        numberPairSet->Add(x);

        if (CurChar() != ';')
        {
            break;
        }
        NextChar();
    }
}